

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
::NewKey(TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
         *this,FPortalID *key)

{
  Node *pNVar1;
  double dVar2;
  FPortalSector *pFVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  FPortalID local_30;
  
  pNVar4 = this->Nodes;
  uVar7 = this->Size - 1;
  uVar5 = SUB84((key->mDisplacement).Y + 103079215104.0,0) * 0x100 +
          (SUB84((key->mDisplacement).X + 103079215104.0,0) >> 8) & uVar7;
  pNVar10 = pNVar4 + uVar5;
  pNVar6 = pNVar10->Next;
  if (pNVar6 == (Node *)0x1) {
    pNVar10->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar8 = pNVar1 + -1;
      pNVar9 = (Node *)0x0;
      if (pNVar1 <= pNVar4) break;
      pNVar9 = pNVar8;
      pNVar1 = pNVar8;
    } while (pNVar8->Next != (Node *)0x1);
    this->LastFree = pNVar8;
    if (pNVar9 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      local_30.mDisplacement.X = (key->mDisplacement).X;
      local_30.mDisplacement.Y = (key->mDisplacement).Y;
      pNVar4 = NewKey(this,&local_30);
    }
    else {
      uVar7 = SUB84((pNVar10->Pair).Key.mDisplacement.Y + 103079215104.0,0) * 0x100 +
              (SUB84((pNVar10->Pair).Key.mDisplacement.X + 103079215104.0,0) >> 8) & uVar7;
      if (uVar7 == uVar5) {
        pNVar9->Next = pNVar6;
        pNVar4 = pNVar9;
        pNVar6 = pNVar9;
      }
      else {
        pNVar4 = pNVar4 + uVar7;
        do {
          pNVar6 = pNVar4;
          pNVar4 = pNVar6->Next;
        } while (pNVar4 != pNVar10);
        pNVar6->Next = pNVar9;
        uVar7 = (pNVar10->Pair).Value.Count;
        (pNVar9->Pair).Value.Most = (pNVar10->Pair).Value.Most;
        (pNVar9->Pair).Value.Count = uVar7;
        pNVar4 = pNVar10->Next;
        dVar2 = (pNVar10->Pair).Key.mDisplacement.X;
        pFVar3 = (pNVar10->Pair).Value.Array;
        (pNVar9->Pair).Key.mDisplacement.Y = (pNVar10->Pair).Key.mDisplacement.Y;
        (pNVar9->Pair).Value.Array = pFVar3;
        pNVar9->Next = pNVar4;
        (pNVar9->Pair).Key.mDisplacement.X = dVar2;
        pNVar4 = (Node *)0x0;
        pNVar6 = pNVar10;
      }
      pNVar10->Next = pNVar4;
      pNVar10 = pNVar6;
    }
    if (pNVar9 == (Node *)0x0) {
      return pNVar4;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar10->Pair).Key.mDisplacement.X = (key->mDisplacement).X;
  (pNVar10->Pair).Key.mDisplacement.Y = (key->mDisplacement).Y;
  return pNVar10;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}